

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_search_set_children_search(XMLSearch *search,XMLSearch *children_search)

{
  XMLSearch *children_search_local;
  XMLSearch *search_local;
  
  if (search == (XMLSearch *)0x0) {
    search_local._4_4_ = 0;
  }
  else {
    if (search->next != (_XMLSearch *)0x0) {
      XMLSearch_free(search->next,1);
    }
    search->next = children_search;
    children_search->prev = search;
    search_local._4_4_ = 1;
  }
  return search_local._4_4_;
}

Assistant:

int XMLSearch_search_set_children_search(XMLSearch* search, XMLSearch* children_search)
{
	if (search == NULL)
		return FALSE;

	if (search->next != NULL)
		XMLSearch_free(search->next, TRUE);

	search->next = children_search;
	children_search->prev = search;

	return TRUE;
}